

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

CreatedTransactionResult *
wallet::FundTransaction
          (CreatedTransactionResult *__return_storage_ptr__,CWallet *wallet,CMutableTransaction *tx,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          UniValue *options,CCoinControl *coinControl,bool override_min_fee)

{
  string_view str;
  string_view strKey;
  string_view key;
  string_view key_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  string_view hex_str;
  bool bVar1;
  VType VVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  pointer pDVar6;
  long lVar7;
  int64_t iVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_bool> pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>,_bool> pVar11;
  CWallet *in_stack_ffffffffffffdec8;
  CCoinControl *this;
  FlatSigningProvider *in_stack_ffffffffffffded0;
  CCoinControl *in_stack_ffffffffffffded8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffdee0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffdee8;
  UniValue *in_stack_ffffffffffffdef0;
  undefined4 in_stack_ffffffffffffdef8;
  undefined4 in_stack_ffffffffffffdefc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  *in_stack_ffffffffffffdf00;
  string *in_stack_ffffffffffffdf08;
  undefined7 in_stack_ffffffffffffdf10;
  undefined1 in_stack_ffffffffffffdf17;
  undefined4 in_stack_ffffffffffffdf18;
  undefined4 uVar12;
  int in_stack_ffffffffffffdf1c;
  FlatSigningProvider *in_stack_ffffffffffffdf20;
  undefined4 in_stack_ffffffffffffdf28;
  int in_stack_ffffffffffffdf2c;
  CCoinControl *in_stack_ffffffffffffdf30;
  CWallet *in_stack_ffffffffffffdf38;
  undefined8 in_stack_ffffffffffffdf58;
  undefined2 uVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
  *in_stack_ffffffffffffdf60;
  UniValue *in_stack_ffffffffffffdf68;
  long in_stack_ffffffffffffdf88;
  undefined1 lockUnspents_00;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *in_stack_ffffffffffffdf90;
  CMutableTransaction *in_stack_ffffffffffffdf98;
  CWallet *in_stack_ffffffffffffdfa0;
  undefined7 in_stack_ffffffffffffe090;
  undefined1 in_stack_ffffffffffffe097;
  bool local_1c1a;
  bool local_1b2a;
  bool local_1a72;
  bool local_19d2;
  undefined1 *local_1950;
  int64_t min_input_weight;
  int64_t weight;
  UniValue *weight_v;
  int vout;
  UniValue *vout_v;
  UniValue *input;
  vector<UniValue,_std::allocator<UniValue>_> *__range2;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *desc;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  *__range4;
  string *desc_str;
  UniValue *desc_univ;
  vector<UniValue,_std::allocator<UniValue>_> *__range3_2;
  string *script_str;
  UniValue *script_univ;
  vector<UniValue,_std::allocator<UniValue>_> *__range3_1;
  UniValue *pk_univ;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  bool local_176f;
  bool local_1769;
  bool local_1760;
  int pos;
  bool local_1752;
  bool lockUnspents;
  bool override_min_fee_local;
  CCoinControl *coinControl_local;
  UniValue *options_local;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients_local;
  CMutableTransaction *tx_local;
  CWallet *wallet_local;
  allocator<char> local_16e9;
  int local_16e8;
  allocator<char> local_16e4 [2];
  undefined1 local_16e2;
  const_iterator __end2;
  const_iterator __begin2;
  allocator<char> local_1692;
  allocator<char> local_1691;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  allocator<char> local_163a;
  allocator<char> local_1639;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_data;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  allocator<char> local_160a;
  allocator<char> local_1609;
  const_iterator __end3;
  const_iterator __begin3;
  allocator<char> local_15f2;
  allocator<char> local_15f1;
  allocator<char> local_15f0;
  allocator<char> local_15ef;
  allocator<char> local_15ee;
  allocator<char> local_15ed;
  allocator<char> local_15ec;
  allocator<char> local_15eb;
  allocator<char> local_15ea [2];
  allocator<char> local_15e8;
  allocator<char> local_15e7;
  allocator<char> local_15e6;
  undefined1 local_15e5;
  _Optional_payload_base<bool> local_15e4;
  allocator<char> local_15e2;
  allocator<char> local_15e1 [12];
  allocator<char> local_15d5 [2];
  allocator<char> local_15d3;
  allocator<char> local_15d2;
  allocator<char> local_15d1;
  allocator<char> local_15d0;
  allocator<char> local_15cf;
  allocator<char> local_15ce;
  allocator<char> local_15cd;
  allocator<char> local_15cc;
  allocator<char> local_15cb;
  allocator<char> local_15ca;
  allocator<char> local_15c9;
  allocator<char> local_15c8;
  allocator<char> local_15c7 [2];
  allocator<char> local_15c5 [2];
  allocator<char> local_15c3;
  allocator<char> local_15c2;
  allocator<char> local_15c1;
  uint local_15c0;
  allocator<char> local_15bb;
  allocator<char> local_15ba;
  allocator<char> local_15b9;
  allocator<char> local_15b8;
  allocator<char> local_15b7 [2];
  allocator<char> local_15b5;
  allocator<char> local_15b4;
  allocator<char> local_15b3;
  allocator<char> local_15b2;
  allocator<char> local_15b1;
  allocator<char> local_15b0;
  allocator<char> local_15af [222];
  undefined1 local_14d1;
  _Optional_payload_base<unsigned_int> local_14d0;
  _Optional_payload_base<int> local_14c8;
  _Base_ptr local_14c0;
  undefined1 local_14b8;
  _Base_ptr local_14b0;
  undefined1 local_14a8;
  _Base_ptr local_14a0;
  undefined1 local_1498;
  optional<OutputType> parsed;
  _Optional_base<unsigned_int,_true,_true> local_1488;
  optional<unsigned_int> change_position;
  CCoinControl local_1438;
  Result<wallet::CreatedTransactionResult> txr;
  Txid txid;
  string error;
  FlatSigningProvider desc_out;
  CScript script;
  CScript wit_script;
  CPubKey pubkey;
  UniValue solving_data;
  UniValue include_watching_option;
  CTxDestination dest;
  string change_address_str;
  undefined1 local_470 [1080];
  undefined1 local_38 [48];
  long local_8;
  
  uVar13 = (undefined2)((ulong)in_stack_ffffffffffffdf58 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14d1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::empty
                         ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffded8);
  inline_check_non_fatal<bool>
            ((bool *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             (char *)in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf1c,
             (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
             (char *)in_stack_ffffffffffffdf08);
  CWallet::BlockUntilSyncedToCurrentChain((CWallet *)in_stack_ffffffffffffdee0._M_current);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_stack_ffffffffffffdec8);
  lockUnspents = false;
  bVar1 = UniValue::isNull((UniValue *)in_stack_ffffffffffffdec8);
  if (bVar1) {
    bVar1 = ParseIncludeWatchonly((UniValue *)in_stack_ffffffffffffded0,in_stack_ffffffffffffdec8);
    coinControl->fAllowWatchOnly = bVar1;
  }
  else {
    VVar2 = UniValue::type((UniValue *)in_stack_ffffffffffffdec8);
    if (VVar2 == VBOOL) {
      bVar1 = UniValue::get_bool((UniValue *)in_stack_ffffffffffffded0);
      coinControl->fAllowWatchOnly = bVar1;
    }
    else {
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[11],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [11])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[15],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [15])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[14],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [14])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[14],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [14])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[15],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [15])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[15],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [15])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[16],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [16])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[12],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [12])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[16],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [16])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[17],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [17])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[7],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [7])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[13],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [13])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[14],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [14])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[9],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [9])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[9],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [9])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[8],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [8])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[5],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [5])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[13],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [13])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[23],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [23])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[26],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [26])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[12],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [12])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[12],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [12])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[14],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [14])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[8],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [8])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[8],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [8])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[14],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [14])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      UniValueType::UniValueType((UniValueType *)in_stack_ffffffffffffdec8,VNULL);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[14],_UniValueType,_true>
                (in_stack_ffffffffffffdf00,
                 (char (*) [14])CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                 (UniValueType *)in_stack_ffffffffffffdef0);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
                   *)in_stack_ffffffffffffdec8);
      __l._M_len = (size_type)in_stack_ffffffffffffdf38;
      __l._M_array = (iterator)in_stack_ffffffffffffdf30;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
             *)in_stack_ffffffffffffdf20,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
            (allocator_type *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10));
      RPCTypeCheckObj(in_stack_ffffffffffffdf68,in_stack_ffffffffffffdf60,
                      SUB21((ushort)uVar13 >> 8,0),SUB21(uVar13,0));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
              *)in_stack_ffffffffffffdec8);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
                    *)in_stack_ffffffffffffdec8);
      local_1950 = local_38;
      do {
        local_1950 = local_1950 + -0x28;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                 *)in_stack_ffffffffffffdec8);
      } while (local_1950 != local_470);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(local_15af);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        bVar1 = UniValue::get_bool((UniValue *)in_stack_ffffffffffffded0);
        coinControl->m_allow_other_inputs = bVar1;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15b0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      local_19d2 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        local_19d2 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                      (string *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15b2);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15b1);
      if (local_19d2 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        }
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffded0);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   in_stack_ffffffffffffdf08);
        if (bVar1) {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15b4);
        }
        else {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15b5);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15b3);
        DecodeDestination((string *)in_stack_ffffffffffffdef0);
        bVar1 = IsValidDestination((CTxDestination *)in_stack_ffffffffffffded0);
        if (!bVar1) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=(&in_stack_ffffffffffffded8->destChange,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_ffffffffffffded0);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      local_1a72 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        local_1a72 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                      (string *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15b8);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(local_15b7);
      if (local_1a72 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        }
        uVar3 = UniValue::getInt<int>((UniValue *)in_stack_ffffffffffffdf20);
        if (bVar1) {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15ba);
        }
        else {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15bb);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15b9);
        if (((int)uVar3 < 0) ||
           (sVar5 = std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::size
                              ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                               in_stack_ffffffffffffdec8), sVar5 < uVar3)) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        local_15c0 = uVar3;
        std::optional<unsigned_int>::optional<unsigned_int,_true>
                  ((optional<unsigned_int> *)in_stack_ffffffffffffded8,
                   (uint *)in_stack_ffffffffffffded0);
        change_position.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)
             local_1488._M_payload.super__Optional_payload_base<unsigned_int>;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15c1);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        local_1b2a = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          local_1b2a = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                        (string *)in_stack_ffffffffffffdec8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15c3);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15c2);
        if (local_1b2a != false) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffded0);
        parsed = ParseOutputType((string *)in_stack_ffffffffffffded0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(local_15c5);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<OutputType> *)in_stack_ffffffffffffdec8);
        if (!bVar1) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
          UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffded0);
          tinyformat::format<std::__cxx11::string>
                    ((char *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdef0);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::optional<OutputType>::value((optional<OutputType> *)in_stack_ffffffffffffded8);
        std::optional<OutputType>::emplace<OutputType&>
                  ((optional<OutputType> *)in_stack_ffffffffffffded8,
                   (OutputType *)in_stack_ffffffffffffded0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      }
      UniValue::UniValue((UniValue *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                         in_stack_ffffffffffffdef0);
      if (bVar1) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15c8);
      }
      else {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15c9);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(local_15c7);
      bVar1 = ParseIncludeWatchonly((UniValue *)in_stack_ffffffffffffded0,in_stack_ffffffffffffdec8)
      ;
      coinControl->fAllowWatchOnly = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      local_1c1a = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        local_1c1a = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                      (string *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15cb);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15ca);
      if (local_1c1a != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          UniValue::operator[]
                    ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        }
        lockUnspents = UniValue::get_bool((UniValue *)in_stack_ffffffffffffded0);
        if (bVar1) {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15cd);
        }
        else {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdec8);
          std::allocator<char>::~allocator(&local_15ce);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15cc);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15cf);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        bVar1 = UniValue::get_bool((UniValue *)in_stack_ffffffffffffded0);
        coinControl->m_include_unsafe_inputs = bVar1;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15d0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15d1);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15d2);
        if (bVar1) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffdee0._M_current,(char *)in_stack_ffffffffffffded8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffdee0._M_current,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffded8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffdee0._M_current,(char *)in_stack_ffffffffffffded8);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15d3);
        if (bVar1) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                                 (string *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(local_15d5);
        if (bVar1) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        AmountFromValue((UniValue *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c);
        CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffdec8,0xc88bd9);
        std::optional<CFeeRate>::operator=
                  ((optional<CFeeRate> *)in_stack_ffffffffffffded8,
                   (CFeeRate *)in_stack_ffffffffffffded0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(local_15e1);
        coinControl->fOverrideFeeRate = true;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15e2);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        local_15e5 = UniValue::get_bool((UniValue *)in_stack_ffffffffffffded0);
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)in_stack_ffffffffffffded8,(bool *)in_stack_ffffffffffffded0);
        (coinControl->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool> = local_15e4;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15e6);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15e7);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        iVar4 = UniValue::getInt<int>((UniValue *)in_stack_ffffffffffffdf20);
        coinControl->m_min_depth = iVar4;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15e8);
        if (coinControl->m_min_depth < 0) {
          uVar9 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                     (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                     (allocator<char> *)in_stack_ffffffffffffdf08);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                               (string *)in_stack_ffffffffffffdec8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(local_15ea);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        UniValue::operator[]
                  ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
        iVar4 = UniValue::getInt<int>((UniValue *)in_stack_ffffffffffffdf20);
        coinControl->m_max_depth = iVar4;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        std::allocator<char>::~allocator(&local_15eb);
        if (coinControl->m_max_depth < coinControl->m_min_depth) {
          uVar9 = __cxa_allocate_exception(0x58);
          tinyformat::format<int,int>
                    ((char *)in_stack_ffffffffffffdf08,(int *)in_stack_ffffffffffffdf00,
                     (int *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8));
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      SetFeeEstimateMode(in_stack_ffffffffffffdf38,in_stack_ffffffffffffdf30,
                         (UniValue *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
                         (UniValue *)in_stack_ffffffffffffdf20,
                         (UniValue *)CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                         (bool)in_stack_ffffffffffffdf17);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15ee);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15ed);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15ec);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdec8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
             (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
             (allocator<char> *)in_stack_ffffffffffffdf08);
  bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,(string *)in_stack_ffffffffffffdec8
                          );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdec8);
  std::allocator<char>::~allocator(&local_15ef);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    UniValue::operator[]((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
    UniValue::get_obj((UniValue *)in_stack_ffffffffffffded0);
    UniValue::UniValue((UniValue *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                       in_stack_ffffffffffffdef0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdec8);
    std::allocator<char>::~allocator(&local_15f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                             (string *)in_stack_ffffffffffffdec8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdec8);
    std::allocator<char>::~allocator(&local_15f1);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      UniValue::get_array((UniValue *)in_stack_ffffffffffffded0);
      UniValue::getValues((UniValue *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8))
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_15f2);
      std::vector<UniValue,_std::allocator<UniValue>_>::begin
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
      __end3 = std::vector<UniValue,_std::allocator<UniValue>_>::end
                         ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
      while (bVar1 = __gnu_cxx::
                     operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_ffffffffffffded8,
                                (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_ffffffffffffded0), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                   *)in_stack_ffffffffffffdec8);
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffded0);
        HexToPubKey((string *)in_stack_ffffffffffffdf30);
        CPubKey::GetID((CPubKey *)in_stack_ffffffffffffdef0);
        pVar10 = std::
                 map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                 ::emplace<CKeyID,CPubKey_const&>
                           ((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                             *)in_stack_ffffffffffffdee8._M_current,
                            (CKeyID *)in_stack_ffffffffffffdee0._M_current,
                            (CPubKey *)in_stack_ffffffffffffded8);
        local_14a0 = (_Base_ptr)pVar10.first._M_node;
        local_1498 = pVar10.second;
        WitnessV0KeyHash::WitnessV0KeyHash
                  ((WitnessV0KeyHash *)in_stack_ffffffffffffdee0._M_current,
                   (CPubKey *)in_stack_ffffffffffffded8);
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
                  (&in_stack_ffffffffffffded8->destChange,
                   (WitnessV0KeyHash *)in_stack_ffffffffffffded0);
        GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffdec8);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_ffffffffffffdec8);
        CScriptID::CScriptID
                  ((CScriptID *)in_stack_ffffffffffffdee0._M_current,
                   (CScript *)in_stack_ffffffffffffded8);
        pVar11 = std::
                 map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                 ::emplace<CScriptID,CScript_const&>
                           ((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                             *)in_stack_ffffffffffffdee8._M_current,
                            (CScriptID *)in_stack_ffffffffffffdee0._M_current,
                            (CScript *)in_stack_ffffffffffffded8);
        local_14b0 = (_Base_ptr)pVar11.first._M_node;
        local_14a8 = pVar11.second;
        CScript::~CScript((CScript *)in_stack_ffffffffffffdec8);
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    *)in_stack_ffffffffffffdec8);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                             (string *)in_stack_ffffffffffffdec8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdec8);
    std::allocator<char>::~allocator(&local_1609);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      UniValue::get_array((UniValue *)in_stack_ffffffffffffded0);
      UniValue::getValues((UniValue *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8))
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_160a);
      std::vector<UniValue,_std::allocator<UniValue>_>::begin
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
      std::vector<UniValue,_std::allocator<UniValue>_>::end
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
      while (bVar1 = __gnu_cxx::
                     operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_ffffffffffffded8,
                                (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_ffffffffffffded0), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                   *)in_stack_ffffffffffffdec8);
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffded0);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdee8._M_current);
        str._M_str._0_4_ = in_stack_ffffffffffffdef8;
        str._M_len = (size_t)in_stack_ffffffffffffdef0;
        str._M_str._4_4_ = in_stack_ffffffffffffdefc;
        in_stack_ffffffffffffe097 = IsHex(str);
        if (!(bool)in_stack_ffffffffffffe097) {
          uVar9 = __cxa_allocate_exception(0x58);
          tinyformat::format<std::__cxx11::string>
                    ((char *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffdef0);
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdee8._M_current);
        hex_str._M_str = (char *)in_stack_ffffffffffffdf38;
        hex_str._M_len = (size_t)in_stack_ffffffffffffdf30;
        ParseHex<unsigned_char>(hex_str);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffded0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffded0);
        CScript::
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)in_stack_ffffffffffffdec8,in_stack_ffffffffffffdee8,
                   in_stack_ffffffffffffdee0);
        CScriptID::CScriptID
                  ((CScriptID *)in_stack_ffffffffffffdee0._M_current,
                   (CScript *)in_stack_ffffffffffffded8);
        pVar11 = std::
                 map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                 ::emplace<CScriptID,CScript_const&>
                           ((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                             *)in_stack_ffffffffffffdee8._M_current,
                            (CScriptID *)in_stack_ffffffffffffdee0._M_current,
                            (CScript *)in_stack_ffffffffffffded8);
        local_14c0 = (_Base_ptr)pVar11.first._M_node;
        local_14b8 = pVar11.second;
        CScript::~CScript((CScript *)in_stack_ffffffffffffdec8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffded8);
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    *)in_stack_ffffffffffffdec8);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,
                             (string *)in_stack_ffffffffffffdec8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdec8);
    std::allocator<char>::~allocator(&local_1639);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (allocator<char> *)in_stack_ffffffffffffdf08);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
      UniValue::get_array((UniValue *)in_stack_ffffffffffffded0);
      UniValue::getValues((UniValue *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8))
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdec8);
      std::allocator<char>::~allocator(&local_163a);
      std::vector<UniValue,_std::allocator<UniValue>_>::begin
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
      std::vector<UniValue,_std::allocator<UniValue>_>::end
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
      while (bVar1 = __gnu_cxx::
                     operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_ffffffffffffded8,
                                (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_ffffffffffffded0), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                   *)in_stack_ffffffffffffdec8);
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffded0);
        FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffdec8);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdee0._M_current);
        std::vector<CScript,_std::allocator<CScript>_>::vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffdec8);
        Parse((string *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
              in_stack_ffffffffffffdf20,
              (string *)CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
              (bool)in_stack_ffffffffffffdf17);
        bVar1 = std::
                vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                         *)in_stack_ffffffffffffded8);
        if (bVar1) {
          uVar9 = __cxa_allocate_exception(0x58);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    ((char *)in_stack_ffffffffffffdf08,&in_stack_ffffffffffffdf00->first,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8));
          JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00c8b767;
        }
        std::
        vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ::begin((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 *)in_stack_ffffffffffffded0);
        __end4 = std::
                 vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 ::end((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                        *)in_stack_ffffffffffffded0);
        while (bVar1 = __gnu_cxx::
                       operator==<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
                                 ((__normal_iterator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
                                   *)in_stack_ffffffffffffded8,
                                  (__normal_iterator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
                                   *)in_stack_ffffffffffffded0), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
          ::operator*((__normal_iterator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
                       *)in_stack_ffffffffffffdec8);
          pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                             ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                              in_stack_ffffffffffffdec8);
          (*pDVar6->_vptr_Descriptor[8])(pDVar6,0,&desc_out,&scripts_temp,&desc_out,0);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
          ::operator++((__normal_iterator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_*,_std::vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>_>
                        *)in_stack_ffffffffffffdec8);
        }
        FlatSigningProvider::Merge
                  ((FlatSigningProvider *)in_stack_ffffffffffffded8,in_stack_ffffffffffffded0);
        std::
        vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   *)in_stack_ffffffffffffded8);
        std::vector<CScript,_std::allocator<CScript>_>::~vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffded8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffdec8);
        FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffdec8);
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    *)in_stack_ffffffffffffdec8);
      }
    }
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdec8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
             (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
             (allocator<char> *)in_stack_ffffffffffffdf08);
  bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,(string *)in_stack_ffffffffffffdec8
                          );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdec8);
  std::allocator<char>::~allocator(&local_1691);
  lockUnspents_00 = (undefined1)((ulong)in_stack_ffffffffffffdf88 >> 0x38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    UniValue::operator[]((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
    UniValue::get_array((UniValue *)in_stack_ffffffffffffded0);
    UniValue::getValues((UniValue *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdec8);
    std::allocator<char>::~allocator(&local_1692);
    std::vector<UniValue,_std::allocator<UniValue>_>::begin
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
    __end2 = std::vector<UniValue,_std::allocator<UniValue>_>::end
                       ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffded0);
    while( true ) {
      lockUnspents_00 = (undefined1)((ulong)in_stack_ffffffffffffdf88 >> 0x38);
      bVar1 = __gnu_cxx::
              operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                        ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                          *)in_stack_ffffffffffffded8,
                         (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                          *)in_stack_ffffffffffffded0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffdfa0 =
           (CWallet *)
           __gnu_cxx::
           __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
           operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                      *)in_stack_ffffffffffffdec8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffdee8._M_current,(char *)in_stack_ffffffffffffdee0._M_current);
      strKey._M_str = (char *)in_stack_ffffffffffffdf08;
      strKey._M_len = (size_t)in_stack_ffffffffffffdf00;
      ParseHashO((UniValue *)in_stack_ffffffffffffded8,strKey);
      transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffdec8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffdee8._M_current,(char *)in_stack_ffffffffffffdee0._M_current);
      key._M_len._7_1_ = in_stack_ffffffffffffdf17;
      key._M_len._0_7_ = in_stack_ffffffffffffdf10;
      key._M_str._0_4_ = in_stack_ffffffffffffdf18;
      key._M_str._4_4_ = in_stack_ffffffffffffdf1c;
      UniValue::find_value(in_stack_ffffffffffffdef0,key);
      bVar1 = UniValue::isNum((UniValue *)in_stack_ffffffffffffdec8);
      if (!bVar1) {
        uVar9 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00c8b767;
      }
      iVar4 = UniValue::getInt<int>((UniValue *)in_stack_ffffffffffffdf20);
      if (iVar4 < 0) {
        uVar9 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00c8b767;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffdee8._M_current,(char *)in_stack_ffffffffffffdee0._M_current);
      key_00._M_len._7_1_ = in_stack_ffffffffffffdf17;
      key_00._M_len._0_7_ = in_stack_ffffffffffffdf10;
      key_00._M_str._0_4_ = in_stack_ffffffffffffdf18;
      key_00._M_str._4_4_ = in_stack_ffffffffffffdf1c;
      UniValue::find_value(in_stack_ffffffffffffdef0,key_00);
      bVar1 = UniValue::isNum((UniValue *)in_stack_ffffffffffffdec8);
      if (!bVar1) {
        uVar9 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00c8b767;
      }
      lVar7 = UniValue::getInt<long>
                        ((UniValue *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28));
      CTxIn::CTxIn((CTxIn *)in_stack_ffffffffffffdec8);
      iVar8 = GetTransactionInputWeight((CTxIn *)in_stack_ffffffffffffded8);
      CTxIn::~CTxIn((CTxIn *)in_stack_ffffffffffffdec8);
      local_16e2 = iVar8 == 0xa5;
      in_stack_ffffffffffffdf88 = iVar8;
      inline_check_non_fatal<bool>
                ((bool *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
                 (char *)in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf1c,
                 (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                 (char *)in_stack_ffffffffffffdf08);
      if (lVar7 < iVar8) {
        uVar9 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
                   (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
                   (allocator<char> *)in_stack_ffffffffffffdf08);
        JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00c8b767;
      }
      if (400000 < lVar7) {
        uVar9 = __cxa_allocate_exception(0x58);
        tinyformat::format<int>
                  ((char *)CONCAT44(in_stack_ffffffffffffdefc,in_stack_ffffffffffffdef8),
                   (int *)in_stack_ffffffffffffdef0);
        JSONRPCError(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf08);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00c8b767;
      }
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffded8,(Txid *)in_stack_ffffffffffffded0,
                 (uint32_t)((ulong)in_stack_ffffffffffffdec8 >> 0x20));
      CCoinControl::SetInputWeight
                (in_stack_ffffffffffffded8,(COutPoint *)in_stack_ffffffffffffded0,
                 (int64_t)in_stack_ffffffffffffdec8);
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                  *)in_stack_ffffffffffffdec8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
             (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
             (allocator<char> *)in_stack_ffffffffffffdf08);
  bVar1 = UniValue::exists((UniValue *)in_stack_ffffffffffffded0,(string *)in_stack_ffffffffffffdec8
                          );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdec8);
  std::allocator<char>::~allocator(local_16e4);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf18),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    UniValue::operator[]((UniValue *)in_stack_ffffffffffffded8,(string *)in_stack_ffffffffffffded0);
    local_16e8 = UniValue::getInt<int>((UniValue *)in_stack_ffffffffffffdf20);
    std::optional<int>::optional<int,_true>
              ((optional<int> *)in_stack_ffffffffffffded8,(int *)in_stack_ffffffffffffded0);
    (coinControl->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> = local_14c8;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdec8);
    std::allocator<char>::~allocator(&local_16e9);
  }
  bVar1 = std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::empty
                    ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                     in_stack_ffffffffffffded8);
  if (bVar1) {
    uVar9 = __cxa_allocate_exception(0x58);
    uVar12 = (undefined4)uVar9;
    iVar4 = (int)((ulong)uVar9 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar4,uVar12),
               (char *)CONCAT17(in_stack_ffffffffffffdf17,in_stack_ffffffffffffdf10),
               (allocator<char> *)in_stack_ffffffffffffdf08);
    JSONRPCError(iVar4,in_stack_ffffffffffffdf08);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(CONCAT44(iVar4,uVar12),&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    local_14d0 = (_Optional_payload_base<unsigned_int>)
                 change_position.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>;
    this = &local_1438;
    CCoinControl::CCoinControl
              ((CCoinControl *)(ulong)CONCAT14(lockUnspents,in_stack_ffffffffffffdef8),this);
    FundTransaction(in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf98,in_stack_ffffffffffffdf90,
                    (optional<unsigned_int>)options,(bool)lockUnspents_00,
                    (CCoinControl *)CONCAT17(in_stack_ffffffffffffe097,in_stack_ffffffffffffe090));
    CCoinControl::~CCoinControl(this);
    bVar1 = util::Result::operator_cast_to_bool((Result<wallet::CreatedTransactionResult> *)this);
    if (bVar1) {
      util::Result<wallet::CreatedTransactionResult>::operator*
                ((Result<wallet::CreatedTransactionResult> *)this);
      CreatedTransactionResult::CreatedTransactionResult
                ((CreatedTransactionResult *)in_stack_ffffffffffffded8,
                 (CreatedTransactionResult *)in_stack_ffffffffffffded0);
      util::Result<wallet::CreatedTransactionResult>::~Result
                ((Result<wallet::CreatedTransactionResult> *)this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return __return_storage_ptr__;
      }
    }
    else {
      uVar9 = __cxa_allocate_exception(0x58);
      util::ErrorString<wallet::CreatedTransactionResult>
                ((Result<wallet::CreatedTransactionResult> *)wallet);
      JSONRPCError(in_stack_ffffffffffffdf1c,(string *)tx);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar9,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
LAB_00c8b767:
  __stack_chk_fail();
}

Assistant:

CreatedTransactionResult FundTransaction(CWallet& wallet, const CMutableTransaction& tx, const std::vector<CRecipient>& recipients, const UniValue& options, CCoinControl& coinControl, bool override_min_fee)
{
    // We want to make sure tx.vout is not used now that we are passing outputs as a vector of recipients.
    // This sets us up to remove tx completely in a future PR in favor of passing the inputs directly.
    CHECK_NONFATAL(tx.vout.empty());
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    std::optional<unsigned int> change_position;
    bool lockUnspents = false;
    if (!options.isNull()) {
      if (options.type() == UniValue::VBOOL) {
        // backward compatibility bool only fallback
        coinControl.fAllowWatchOnly = options.get_bool();
      }
      else {
        RPCTypeCheckObj(options,
            {
                {"add_inputs", UniValueType(UniValue::VBOOL)},
                {"include_unsafe", UniValueType(UniValue::VBOOL)},
                {"add_to_wallet", UniValueType(UniValue::VBOOL)},
                {"changeAddress", UniValueType(UniValue::VSTR)},
                {"change_address", UniValueType(UniValue::VSTR)},
                {"changePosition", UniValueType(UniValue::VNUM)},
                {"change_position", UniValueType(UniValue::VNUM)},
                {"change_type", UniValueType(UniValue::VSTR)},
                {"includeWatching", UniValueType(UniValue::VBOOL)},
                {"include_watching", UniValueType(UniValue::VBOOL)},
                {"inputs", UniValueType(UniValue::VARR)},
                {"lockUnspents", UniValueType(UniValue::VBOOL)},
                {"lock_unspents", UniValueType(UniValue::VBOOL)},
                {"locktime", UniValueType(UniValue::VNUM)},
                {"fee_rate", UniValueType()}, // will be checked by AmountFromValue() in SetFeeEstimateMode()
                {"feeRate", UniValueType()}, // will be checked by AmountFromValue() below
                {"psbt", UniValueType(UniValue::VBOOL)},
                {"solving_data", UniValueType(UniValue::VOBJ)},
                {"subtractFeeFromOutputs", UniValueType(UniValue::VARR)},
                {"subtract_fee_from_outputs", UniValueType(UniValue::VARR)},
                {"replaceable", UniValueType(UniValue::VBOOL)},
                {"conf_target", UniValueType(UniValue::VNUM)},
                {"estimate_mode", UniValueType(UniValue::VSTR)},
                {"minconf", UniValueType(UniValue::VNUM)},
                {"maxconf", UniValueType(UniValue::VNUM)},
                {"input_weights", UniValueType(UniValue::VARR)},
                {"max_tx_weight", UniValueType(UniValue::VNUM)},
            },
            true, true);

        if (options.exists("add_inputs")) {
            coinControl.m_allow_other_inputs = options["add_inputs"].get_bool();
        }

        if (options.exists("changeAddress") || options.exists("change_address")) {
            const std::string change_address_str = (options.exists("change_address") ? options["change_address"] : options["changeAddress"]).get_str();
            CTxDestination dest = DecodeDestination(change_address_str);

            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Change address must be a valid bitcoin address");
            }

            coinControl.destChange = dest;
        }

        if (options.exists("changePosition") || options.exists("change_position")) {
            int pos = (options.exists("change_position") ? options["change_position"] : options["changePosition"]).getInt<int>();
            if (pos < 0 || (unsigned int)pos > recipients.size()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "changePosition out of bounds");
            }
            change_position = (unsigned int)pos;
        }

        if (options.exists("change_type")) {
            if (options.exists("changeAddress") || options.exists("change_address")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both change address and address type options");
            }
            if (std::optional<OutputType> parsed = ParseOutputType(options["change_type"].get_str())) {
                coinControl.m_change_type.emplace(parsed.value());
            } else {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown change type '%s'", options["change_type"].get_str()));
            }
        }

        const UniValue include_watching_option = options.exists("include_watching") ? options["include_watching"] : options["includeWatching"];
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(include_watching_option, wallet);

        if (options.exists("lockUnspents") || options.exists("lock_unspents")) {
            lockUnspents = (options.exists("lock_unspents") ? options["lock_unspents"] : options["lockUnspents"]).get_bool();
        }

        if (options.exists("include_unsafe")) {
            coinControl.m_include_unsafe_inputs = options["include_unsafe"].get_bool();
        }

        if (options.exists("feeRate")) {
            if (options.exists("fee_rate")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both fee_rate (" + CURRENCY_ATOM + "/vB) and feeRate (" + CURRENCY_UNIT + "/kvB)");
            }
            if (options.exists("conf_target")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate.");
            }
            if (options.exists("estimate_mode")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both estimate_mode and feeRate");
            }
            coinControl.m_feerate = CFeeRate(AmountFromValue(options["feeRate"]));
            coinControl.fOverrideFeeRate = true;
        }

        if (options.exists("replaceable")) {
            coinControl.m_signal_bip125_rbf = options["replaceable"].get_bool();
        }

        if (options.exists("minconf")) {
            coinControl.m_min_depth = options["minconf"].getInt<int>();

            if (coinControl.m_min_depth < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative minconf");
            }
        }

        if (options.exists("maxconf")) {
            coinControl.m_max_depth = options["maxconf"].getInt<int>();

            if (coinControl.m_max_depth < coinControl.m_min_depth) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("maxconf can't be lower than minconf: %d < %d", coinControl.m_max_depth, coinControl.m_min_depth));
            }
        }
        SetFeeEstimateMode(wallet, coinControl, options["conf_target"], options["estimate_mode"], options["fee_rate"], override_min_fee);
      }
    } else {
        // if options is null and not a bool
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(NullUniValue, wallet);
    }

    if (options.exists("solving_data")) {
        const UniValue solving_data = options["solving_data"].get_obj();
        if (solving_data.exists("pubkeys")) {
            for (const UniValue& pk_univ : solving_data["pubkeys"].get_array().getValues()) {
                const CPubKey pubkey = HexToPubKey(pk_univ.get_str());
                coinControl.m_external_provider.pubkeys.emplace(pubkey.GetID(), pubkey);
                // Add witness script for pubkeys
                const CScript wit_script = GetScriptForDestination(WitnessV0KeyHash(pubkey));
                coinControl.m_external_provider.scripts.emplace(CScriptID(wit_script), wit_script);
            }
        }

        if (solving_data.exists("scripts")) {
            for (const UniValue& script_univ : solving_data["scripts"].get_array().getValues()) {
                const std::string& script_str = script_univ.get_str();
                if (!IsHex(script_str)) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' is not hex", script_str));
                }
                std::vector<unsigned char> script_data(ParseHex(script_str));
                const CScript script(script_data.begin(), script_data.end());
                coinControl.m_external_provider.scripts.emplace(CScriptID(script), script);
            }
        }

        if (solving_data.exists("descriptors")) {
            for (const UniValue& desc_univ : solving_data["descriptors"].get_array().getValues()) {
                const std::string& desc_str  = desc_univ.get_str();
                FlatSigningProvider desc_out;
                std::string error;
                std::vector<CScript> scripts_temp;
                auto descs = Parse(desc_str, desc_out, error, true);
                if (descs.empty()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Unable to parse descriptor '%s': %s", desc_str, error));
                }
                for (auto& desc : descs) {
                    desc->Expand(0, desc_out, scripts_temp, desc_out);
                }
                coinControl.m_external_provider.Merge(std::move(desc_out));
            }
        }
    }

    if (options.exists("input_weights")) {
        for (const UniValue& input : options["input_weights"].get_array().getValues()) {
            Txid txid = Txid::FromUint256(ParseHashO(input, "txid"));

            const UniValue& vout_v = input.find_value("vout");
            if (!vout_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
            }
            int vout = vout_v.getInt<int>();
            if (vout < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");
            }

            const UniValue& weight_v = input.find_value("weight");
            if (!weight_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing weight key");
            }
            int64_t weight = weight_v.getInt<int64_t>();
            const int64_t min_input_weight = GetTransactionInputWeight(CTxIn());
            CHECK_NONFATAL(min_input_weight == 165);
            if (weight < min_input_weight) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)");
            }
            if (weight > MAX_STANDARD_TX_WEIGHT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d", MAX_STANDARD_TX_WEIGHT));
            }

            coinControl.SetInputWeight(COutPoint(txid, vout), weight);
        }
    }

    if (options.exists("max_tx_weight")) {
        coinControl.m_max_tx_weight = options["max_tx_weight"].getInt<int>();
    }

    if (recipients.empty())
        throw JSONRPCError(RPC_INVALID_PARAMETER, "TX must have at least one output");

    auto txr = FundTransaction(wallet, tx, recipients, change_position, lockUnspents, coinControl);
    if (!txr) {
        throw JSONRPCError(RPC_WALLET_ERROR, ErrorString(txr).original);
    }
    return *txr;
}